

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

Am_Value_List get_new_slots_and_values(Am_Object *cmd,Am_Value *new_value,Am_Value *new_obj_val)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  ostream *poVar3;
  Am_Value *in_RCX;
  Am_List_Item *extraout_RDX;
  Am_Value_List AVar4;
  Am_Am_Slot_Key key;
  Am_Object fake_start_object;
  Am_Value target_v;
  Am_Value_List just_slots;
  Am_Value local_48;
  Am_Assoc local_38;
  
  fake_start_object.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value::Valid(in_RCX);
  if ((!bVar1) || (in_RCX->type != 0xa001)) {
    in_RCX = Am_Object::Get((Am_Object *)new_value,0x11a,0);
  }
  Am_Object::operator=(&fake_start_object,in_RCX);
  Am_Value_List::Am_Value_List((Am_Value_List *)cmd);
  pAVar2 = Am_Object::Get(&fake_start_object,0xb8,0);
  Am_Value_List::Am_Value_List(&just_slots,pAVar2);
  key.value = 0;
  target_v.type = 0;
  target_v.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(&just_slots);
  while( true ) {
    bVar1 = Am_Value_List::Last(&just_slots);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&just_slots);
    Am_Am_Slot_Key::operator=(&key,pAVar2);
    pAVar2 = Am_Object::Get(&fake_start_object,key.value,0);
    Am_Value::operator=(&target_v,pAVar2);
    local_48.value.long_value._2_6_ = 0;
    local_48.value.long_value._0_2_ = key.value;
    local_48.type = 0x4015;
    Am_Assoc::Am_Assoc(&local_38,&local_48,&target_v);
    value = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_38);
    Am_Value_List::Add((Am_Value_List *)cmd,value,Am_TAIL,true);
    Am_Assoc::~Am_Assoc(&local_38);
    Am_Value::~Am_Value(&local_48);
    Am_Value_List::Next(&just_slots);
  }
  if (am_sdebug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Create new slots_and_values_used from ");
    poVar3 = operator<<(poVar3,(Am_Object *)new_value);
    poVar3 = std::operator<<(poVar3," and new val ");
    poVar3 = operator<<(poVar3,new_obj_val);
    poVar3 = std::operator<<(poVar3," start object ");
    poVar3 = operator<<(poVar3,&fake_start_object);
    poVar3 = std::operator<<(poVar3," list ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)cmd);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  Am_Value::~Am_Value(&target_v);
  Am_Value_List::~Am_Value_List(&just_slots);
  Am_Object::~Am_Object(&fake_start_object);
  AVar4.item = extraout_RDX;
  AVar4.data = (Am_Value_List_Data *)cmd;
  return AVar4;
}

Assistant:

Am_Value_List
get_new_slots_and_values(Am_Object &cmd, Am_Value &new_value,
                         Am_Value new_obj_val)
{
  Am_Object fake_start_object;
  if (new_obj_val.Valid() && new_obj_val.type == Am_OBJECT)
    fake_start_object = new_obj_val;
  else
    fake_start_object = cmd.Get(Am_START_OBJECT);
  // **** do something with new_value ****
  Am_Value_List slots_and_values_used;
  Am_Value_List just_slots = fake_start_object.Get(Am_SLOTS_TO_SAVE);
  Am_Am_Slot_Key key;
  Am_Value target_v;
  for (just_slots.Start(); !just_slots.Last(); just_slots.Next()) {
    key = just_slots.Get();
    target_v = fake_start_object.Get(key);
    slots_and_values_used.Add(Am_Assoc(key, target_v));
  }
  if (am_sdebug)
    std::cout << "Create new slots_and_values_used from " << cmd
              << " and new val " << new_value << " start object "
              << fake_start_object << " list " << slots_and_values_used
              << std::endl
              << std::flush;
  return slots_and_values_used;
}